

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

void __thiscall
Fl_Preferences::Fl_Preferences(Fl_Preferences *this,Fl_Preferences *parent,char *group)

{
  Node *pNVar1;
  RootNode *pRVar2;
  
  this->_vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Plugin_Manager_002572b8;
  if ((parent == (Fl_Preferences *)0x0) &&
     (parent = runtimePrefs, runtimePrefs == (Fl_Preferences *)0x0)) {
    parent = (Fl_Preferences *)operator_new(0x18);
    parent->_vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Plugin_Manager_002572b8;
    parent->node = (Node *)0x0;
    parent->rootNode = (RootNode *)0x0;
    runtimePrefs = parent;
    pNVar1 = (Node *)operator_new(0x48);
    Node::Node(pNVar1,".");
    parent->node = pNVar1;
    pRVar2 = (RootNode *)operator_new(0x20);
    pRVar2->prefs_ = parent;
    pRVar2->application_ = (char *)0x0;
    pRVar2->filename_ = (char *)0x0;
    pRVar2->vendor_ = (char *)0x0;
    parent->rootNode = pRVar2;
    pNVar1->field_2 = (anon_union_8_2_d68c4589_for_Node_2)this->rootNode;
    pNVar1->field_0x30 = pNVar1->field_0x30 | 2;
  }
  this->rootNode = parent->rootNode;
  pNVar1 = Node::addChild(parent->node,group);
  this->node = pNVar1;
  return;
}

Assistant:

Fl_Preferences::Fl_Preferences( Fl_Preferences *parent, const char *group ) {
  if (parent==0) {
    if (!runtimePrefs) {
      runtimePrefs = new Fl_Preferences();
      runtimePrefs->node = new Node( "." );
      runtimePrefs->rootNode = new RootNode( runtimePrefs );
      runtimePrefs->node->setRoot(rootNode);
    }
    parent = runtimePrefs;
  }
  rootNode = parent->rootNode;
  node = parent->node->addChild( group );
}